

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_test.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  string *in_stack_00000018;
  string timestampSeparator;
  string logFileName;
  allocator<char> local_69;
  string local_68 [24];
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  allocator<char> local_31;
  string local_30 [8];
  string *in_stack_ffffffffffffffd8;
  string *in_stack_ffffffffffffffe0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::allocator<char>::~allocator(&local_69);
  juzzlin::FileTest::initializeLoggger(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  juzzlin::FileTest::testAllLoggingLevels_allMessagesShouldBeFoundInFile
            ((string *)timestampSeparator._0_8_,in_stack_00000018);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int main(int, char **)
{
    const std::string logFileName = "file_test.log";
    const std::string timestampSeparator = " ## ";

    juzzlin::FileTest::initializeLoggger(logFileName, timestampSeparator);

    juzzlin::FileTest::testAllLoggingLevels_allMessagesShouldBeFoundInFile(logFileName, timestampSeparator);

    return EXIT_SUCCESS;
}